

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void ecs_map_memory(ecs_map_t *map,int32_t *allocd,int32_t *used)

{
  int iVar1;
  ecs_bucket_t *peVar2;
  long lVar3;
  int iVar4;
  
  _ecs_assert(map != (ecs_map_t *)0x0,2,(char *)0x0,"map != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0x1ea);
  if (map != (ecs_map_t *)0x0) {
    if (used != (int32_t *)0x0) {
      *used = map->elem_size * map->count;
    }
    if (allocd != (int32_t *)0x0) {
      *allocd = *allocd + 0x18;
      iVar1 = map->bucket_count;
      if (0 < (long)iVar1) {
        peVar2 = map->buckets;
        lVar3 = 0;
        do {
          iVar4 = *(int *)((long)&peVar2->count + lVar3) * 8 + *allocd;
          *allocd = iVar4;
          *allocd = *(int *)((long)&peVar2->count + lVar3) * map->elem_size + iVar4;
          lVar3 = lVar3 + 0x18;
        } while ((long)iVar1 * 0x18 != lVar3);
      }
      *allocd = *allocd + iVar1 * 0x18;
    }
    return;
  }
  __assert_fail("map != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x1ea,"void ecs_map_memory(ecs_map_t *, int32_t *, int32_t *)");
}

Assistant:

void ecs_map_memory(
    ecs_map_t *map, 
    int32_t *allocd,
    int32_t *used)
{
    ecs_assert(map != NULL, ECS_INVALID_PARAMETER, NULL);

    if (used) {
        *used = map->count * map->elem_size;
    }

    if (allocd) {
        *allocd += ECS_SIZEOF(ecs_map_t);

        int i, bucket_count = map->bucket_count;
        for (i = 0; i < bucket_count; i ++) {
            ecs_bucket_t *bucket = &map->buckets[i];
            *allocd += KEY_SIZE * bucket->count;
            *allocd += map->elem_size * bucket->count;
        }

        *allocd += ECS_SIZEOF(ecs_bucket_t) * bucket_count;
    }
}